

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aesni.c
# Opt level: O0

void mbedtls_aesni_gcm_mult(uchar *c,uchar *a,uchar *b)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong local_60;
  size_t i;
  uchar cc [16];
  uchar bb [16];
  uchar aa [16];
  uchar *b_local;
  uchar *a_local;
  uchar *c_local;
  
  for (local_60 = 0; local_60 < 0x10; local_60 = local_60 + 1) {
    bb[local_60 + 8] = a[0xf - local_60];
    cc[local_60 + 8] = b[0xf - local_60];
  }
  auVar12._8_8_ = 0;
  auVar12[0] = cc[8];
  auVar12[1] = cc[9];
  auVar12[2] = cc[10];
  auVar12[3] = cc[0xb];
  auVar12[4] = cc[0xc];
  auVar12[5] = cc[0xd];
  auVar12[6] = cc[0xe];
  auVar12[7] = cc[0xf];
  auVar2._8_8_ = 0;
  auVar2[0] = bb[8];
  auVar2[1] = bb[9];
  auVar2[2] = bb[10];
  auVar2[3] = bb[0xb];
  auVar2[4] = bb[0xc];
  auVar2[5] = bb[0xd];
  auVar2[6] = bb[0xe];
  auVar2[7] = bb[0xf];
  auVar11 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar12 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar11 = auVar11 ^ auVar2 << uVar1;
    }
  }
  auVar7._8_8_ = 0;
  auVar7[0] = bb[0];
  auVar7[1] = bb[1];
  auVar7[2] = bb[2];
  auVar7[3] = bb[3];
  auVar7[4] = bb[4];
  auVar7[5] = bb[5];
  auVar7[6] = bb[6];
  auVar7[7] = bb[7];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = aa._0_8_;
  auVar12 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar7 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar12 = auVar12 ^ auVar8 << uVar1;
    }
  }
  auVar5._8_8_ = 0;
  auVar5[0] = cc[8];
  auVar5[1] = cc[9];
  auVar5[2] = cc[10];
  auVar5[3] = cc[0xb];
  auVar5[4] = cc[0xc];
  auVar5[5] = cc[0xd];
  auVar5[6] = cc[0xe];
  auVar5[7] = cc[0xf];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = aa._0_8_;
  auVar2 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar2 = auVar2 ^ auVar6 << uVar1;
    }
  }
  auVar3._8_8_ = 0;
  auVar3[0] = bb[0];
  auVar3[1] = bb[1];
  auVar3[2] = bb[2];
  auVar3[3] = bb[3];
  auVar3[4] = bb[4];
  auVar3[5] = bb[5];
  auVar3[6] = bb[6];
  auVar3[7] = bb[7];
  auVar4._8_8_ = 0;
  auVar4[0] = bb[8];
  auVar4[1] = bb[9];
  auVar4[2] = bb[10];
  auVar4[3] = bb[0xb];
  auVar4[4] = bb[0xc];
  auVar4[5] = bb[0xd];
  auVar4[6] = bb[0xe];
  auVar4[7] = bb[0xf];
  auVar7 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar3 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar7 = auVar7 ^ auVar4 << uVar1;
    }
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SUB168(auVar7 ^ auVar2,0);
  auVar12 = auVar12 ^ (auVar7 ^ auVar2) >> 0x40;
  auVar11 = auVar11 ^ auVar9 << 0x40;
  uVar10 = auVar11._0_8_;
  uVar10 = (auVar11._8_8_ << 1 | uVar10 >> 0x3f) ^ uVar10 << 0x3f ^ uVar10 << 0x3a;
  uVar10 = uVar10 >> 1 ^ uVar10 >> 2 ^ uVar10 >> 7 ^ uVar10 ^
           (auVar12._8_8_ << 1 | auVar12._0_8_ >> 0x3f);
  cc[0] = (char)uVar10;
  cc[1] = (char)(uVar10 >> 8);
  cc[2] = (char)(uVar10 >> 0x10);
  cc[3] = (char)(uVar10 >> 0x18);
  cc[4] = (char)(uVar10 >> 0x20);
  cc[5] = (char)(uVar10 >> 0x28);
  cc[6] = (char)(uVar10 >> 0x30);
  cc[7] = (char)(uVar10 >> 0x38);
  for (local_60 = 0; local_60 < 0x10; local_60 = local_60 + 1) {
    c[local_60] = cc[7 - local_60];
  }
  return;
}

Assistant:

void mbedtls_aesni_gcm_mult( unsigned char c[16],
                     const unsigned char a[16],
                     const unsigned char b[16] )
{
    unsigned char aa[16], bb[16], cc[16];
    size_t i;

    /* The inputs are in big-endian order, so byte-reverse them */
    for( i = 0; i < 16; i++ )
    {
        aa[i] = a[15 - i];
        bb[i] = b[15 - i];
    }

    asm( "movdqu (%0), %%xmm0               \n\t" // a1:a0
         "movdqu (%1), %%xmm1               \n\t" // b1:b0

         /*
          * Caryless multiplication xmm2:xmm1 = xmm0 * xmm1
          * using [CLMUL-WP] algorithm 1 (p. 13).
          */
         "movdqa %%xmm1, %%xmm2             \n\t" // copy of b1:b0
         "movdqa %%xmm1, %%xmm3             \n\t" // same
         "movdqa %%xmm1, %%xmm4             \n\t" // same
         PCLMULQDQ xmm0_xmm1 ",0x00         \n\t" // a0*b0 = c1:c0
         PCLMULQDQ xmm0_xmm2 ",0x11         \n\t" // a1*b1 = d1:d0
         PCLMULQDQ xmm0_xmm3 ",0x10         \n\t" // a0*b1 = e1:e0
         PCLMULQDQ xmm0_xmm4 ",0x01         \n\t" // a1*b0 = f1:f0
         "pxor %%xmm3, %%xmm4               \n\t" // e1+f1:e0+f0
         "movdqa %%xmm4, %%xmm3             \n\t" // same
         "psrldq $8, %%xmm4                 \n\t" // 0:e1+f1
         "pslldq $8, %%xmm3                 \n\t" // e0+f0:0
         "pxor %%xmm4, %%xmm2               \n\t" // d1:d0+e1+f1
         "pxor %%xmm3, %%xmm1               \n\t" // c1+e0+f1:c0

         /*
          * Now shift the result one bit to the left,
          * taking advantage of [CLMUL-WP] eq 27 (p. 20)
          */
         "movdqa %%xmm1, %%xmm3             \n\t" // r1:r0
         "movdqa %%xmm2, %%xmm4             \n\t" // r3:r2
         "psllq $1, %%xmm1                  \n\t" // r1<<1:r0<<1
         "psllq $1, %%xmm2                  \n\t" // r3<<1:r2<<1
         "psrlq $63, %%xmm3                 \n\t" // r1>>63:r0>>63
         "psrlq $63, %%xmm4                 \n\t" // r3>>63:r2>>63
         "movdqa %%xmm3, %%xmm5             \n\t" // r1>>63:r0>>63
         "pslldq $8, %%xmm3                 \n\t" // r0>>63:0
         "pslldq $8, %%xmm4                 \n\t" // r2>>63:0
         "psrldq $8, %%xmm5                 \n\t" // 0:r1>>63
         "por %%xmm3, %%xmm1                \n\t" // r1<<1|r0>>63:r0<<1
         "por %%xmm4, %%xmm2                \n\t" // r3<<1|r2>>62:r2<<1
         "por %%xmm5, %%xmm2                \n\t" // r3<<1|r2>>62:r2<<1|r1>>63

         /*
          * Now reduce modulo the GCM polynomial x^128 + x^7 + x^2 + x + 1
          * using [CLMUL-WP] algorithm 5 (p. 20).
          * Currently xmm2:xmm1 holds x3:x2:x1:x0 (already shifted).
          */
         /* Step 2 (1) */
         "movdqa %%xmm1, %%xmm3             \n\t" // x1:x0
         "movdqa %%xmm1, %%xmm4             \n\t" // same
         "movdqa %%xmm1, %%xmm5             \n\t" // same
         "psllq $63, %%xmm3                 \n\t" // x1<<63:x0<<63 = stuff:a
         "psllq $62, %%xmm4                 \n\t" // x1<<62:x0<<62 = stuff:b
         "psllq $57, %%xmm5                 \n\t" // x1<<57:x0<<57 = stuff:c

         /* Step 2 (2) */
         "pxor %%xmm4, %%xmm3               \n\t" // stuff:a+b
         "pxor %%xmm5, %%xmm3               \n\t" // stuff:a+b+c
         "pslldq $8, %%xmm3                 \n\t" // a+b+c:0
         "pxor %%xmm3, %%xmm1               \n\t" // x1+a+b+c:x0 = d:x0

         /* Steps 3 and 4 */
         "movdqa %%xmm1,%%xmm0              \n\t" // d:x0
         "movdqa %%xmm1,%%xmm4              \n\t" // same
         "movdqa %%xmm1,%%xmm5              \n\t" // same
         "psrlq $1, %%xmm0                  \n\t" // e1:x0>>1 = e1:e0'
         "psrlq $2, %%xmm4                  \n\t" // f1:x0>>2 = f1:f0'
         "psrlq $7, %%xmm5                  \n\t" // g1:x0>>7 = g1:g0'
         "pxor %%xmm4, %%xmm0               \n\t" // e1+f1:e0'+f0'
         "pxor %%xmm5, %%xmm0               \n\t" // e1+f1+g1:e0'+f0'+g0'
         // e0'+f0'+g0' is almost e0+f0+g0, ex\tcept for some missing
         // bits carried from d. Now get those\t bits back in.
         "movdqa %%xmm1,%%xmm3              \n\t" // d:x0
         "movdqa %%xmm1,%%xmm4              \n\t" // same
         "movdqa %%xmm1,%%xmm5              \n\t" // same
         "psllq $63, %%xmm3                 \n\t" // d<<63:stuff
         "psllq $62, %%xmm4                 \n\t" // d<<62:stuff
         "psllq $57, %%xmm5                 \n\t" // d<<57:stuff
         "pxor %%xmm4, %%xmm3               \n\t" // d<<63+d<<62:stuff
         "pxor %%xmm5, %%xmm3               \n\t" // missing bits of d:stuff
         "psrldq $8, %%xmm3                 \n\t" // 0:missing bits of d
         "pxor %%xmm3, %%xmm0               \n\t" // e1+f1+g1:e0+f0+g0
         "pxor %%xmm1, %%xmm0               \n\t" // h1:h0
         "pxor %%xmm2, %%xmm0               \n\t" // x3+h1:x2+h0

         "movdqu %%xmm0, (%2)               \n\t" // done
         :
         : "r" (aa), "r" (bb), "r" (cc)
         : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5" );

    /* Now byte-reverse the outputs */
    for( i = 0; i < 16; i++ )
        c[i] = cc[15 - i];

    return;
}